

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_utils.cpp
# Opt level: O1

Loop * __thiscall
spvtools::opt::LoopUtils::CloneAndAttachLoopToHeader
          (LoopUtils *this,LoopCloningResult *cloning_result)

{
  IRContext *pIVar1;
  Loop *pLVar2;
  pointer pOVar3;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var4;
  DefUseManager *this_00;
  LoopCloningResult *pLVar5;
  char cVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  Instruction *pIVar9;
  undefined4 extraout_var;
  BasicBlock *pBVar10;
  pointer puVar11;
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> _Var12;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *puVar13;
  uint *extraout_RDX_03;
  uint *extraout_RDX_04;
  ulong uVar14;
  pointer pOVar15;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> new_exit_bb
  ;
  string message;
  InstructionBuilder builder;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> local_e0;
  _Any_data local_d8;
  IRContext *local_c8;
  code *pcStack_c0;
  ulong local_b0;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *local_a8
  ;
  LoopCloningResult *local_a0;
  function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> *local_98
  ;
  undefined8 uStack_90;
  code *local_88;
  code *pcStack_80;
  Loop *local_78;
  pointer local_70;
  pointer local_68;
  Instruction *local_60;
  InstructionBuilder local_58;
  
  local_a0 = cloning_result;
  local_78 = CloneLoop(this,cloning_result);
  pIVar9 = (Instruction *)operator_new(0x70);
  pIVar1 = this->context_;
  uVar7 = Module::TakeNextIdBound
                    ((pIVar1->module_)._M_t.
                     super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                     .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl);
  if ((uVar7 == 0) && ((pIVar1->consumer_).super__Function_base._M_manager != (_Manager_type)0x0)) {
    local_a8 = &pIVar1->consumer_;
    local_58.context_ = (IRContext *)0x25;
    local_d8._M_unused._M_object = &local_c8;
    local_d8._M_unused._0_8_ =
         (undefined8)std::__cxx11::string::_M_create((ulong *)local_d8._M_pod_data,(ulong)&local_58)
    ;
    local_c8 = local_58.context_;
    *(undefined8 *)local_d8._M_unused._0_8_ = 0x667265766f204449;
    *(undefined8 *)((long)local_d8._M_unused._0_8_ + 8) = 0x797254202e776f6c;
    *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x10) = 0x676e696e6e757220;
    *(undefined8 *)((long)local_d8._M_unused._0_8_ + 0x18) = 0x746361706d6f6320;
    builtin_strncpy((char *)((long)local_d8._M_unused._0_8_ + 0x1d),"act-ids.",8);
    local_d8._8_8_ = local_58.context_;
    *(char *)((long)local_d8._M_unused._0_8_ + (long)(local_58.context_ + -1 + 1)) = '\0';
    local_58.context_ = (IRContext *)0x0;
    local_58.parent_ = (BasicBlock *)0x0;
    local_58.insert_before_.super_iterator.node_ = (iterator)(Instruction *)0x0;
    std::function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
    operator()(local_a8,SPV_MSG_ERROR,"",(spv_position_t *)&local_58,
               (char *)local_d8._M_unused._0_8_);
    if ((IRContext **)local_d8._M_unused._0_8_ != &local_c8) {
      operator_delete(local_d8._M_unused._M_object,(ulong)((long)&local_c8->syntax_context_ + 1));
    }
  }
  local_d8._M_unused._M_object =
       (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)> **)
       0x0;
  local_d8._8_8_ = 0;
  uVar8 = 0;
  local_c8 = (IRContext *)0x0;
  Instruction::Instruction(pIVar9,pIVar1,OpLabel,0,uVar7,(OperandList *)&local_d8);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_d8);
  local_e0._M_head_impl = (BasicBlock *)operator_new(0x88);
  (local_e0._M_head_impl)->function_ = (Function *)0x0;
  ((local_e0._M_head_impl)->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = pIVar9;
  pIVar9 = &((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
            sentinel_;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00b15d30;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  unique_id_ = 0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  context_ = (IRContext *)0x0;
  *(undefined8 *)
   ((long)&((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
           sentinel_.context_ + 6) = 0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  operands_.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_scope_.lexical_scope_ = 0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  dbg_scope_.inlined_at_ = 0;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar9;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar9;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  ((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
  _vptr_IntrusiveList = (_func_int **)&PTR__InstructionList_00b15dc8;
  pLVar2 = this->loop_;
  (local_e0._M_head_impl)->function_ = pLVar2->loop_merge_->function_;
  local_58.context_ = this->context_;
  local_58.insert_before_.super_iterator.node_ =
       (iterator)
       &((local_e0._M_head_impl)->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  local_58.preserved_analyses_ = kAnalysisNone;
  pIVar9 = (pLVar2->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_58.parent_ = local_e0._M_head_impl;
  if (pIVar9->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  InstructionBuilder::AddBranch(&local_58,uVar8);
  pLVar5 = local_a0;
  pIVar9 = (this->loop_->loop_merge_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_b0 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
    uVar14 = (ulong)uVar7;
    puVar13 = extraout_RDX_00;
  }
  else {
    uVar14 = 0;
    puVar13 = extraout_RDX;
  }
  pIVar9 = ((local_e0._M_head_impl)->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar9->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
    local_b0 = CONCAT44(extraout_var,uVar7);
    puVar13 = extraout_RDX_01;
  }
  puVar11 = (pLVar5->cloned_bb_).
            super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_70 = (pLVar5->cloned_bb_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != local_70) {
    local_a8 = (function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                *)(local_b0 << 0x20 | uVar14);
    do {
      pBVar10 = (puVar11->_M_t).
                super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl;
      local_68 = puVar11;
      for (pIVar9 = (pBVar10->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                    super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          pIVar9 != &(pBVar10->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
          pIVar9 = (pIVar9->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_) {
        uStack_90 = 0;
        local_98 = local_a8;
        pcStack_80 = std::
                     _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:514:32)>
                     ::_M_invoke;
        local_88 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:514:32)>
                   ::_M_manager;
        local_d8._8_8_ = 0;
        local_d8._M_unused._M_object = &local_98;
        pcStack_c0 = std::
                     _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:876:22)>
                     ::_M_invoke;
        local_c8 = (IRContext *)
                   std::
                   _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:876:22)>
                   ::_M_manager;
        pOVar3 = (pIVar9->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pOVar15 = *(pointer *)
                        &(pIVar9->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl; pOVar15 != pOVar3; pOVar15 = pOVar15 + 1) {
          if ((pOVar15->type & ~SPV_OPERAND_TYPE_ID) != SPV_OPERAND_TYPE_TYPE_ID) {
            _Var4._M_head_impl =
                 *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                  &(pOVar15->words).large_data_._M_t.
                   super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ;
            _Var12._M_head_impl =
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &(pOVar15->words).small_data_;
            if ((tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )_Var4._M_head_impl !=
                (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
                0x0) {
              _Var12._M_head_impl = _Var4._M_head_impl;
            }
            local_60 = *(Instruction **)_Var12._M_head_impl;
            if (local_c8 == (IRContext *)0x0) {
              std::__throw_bad_function_call();
            }
            cVar6 = (*pcStack_c0)(&local_d8,&local_60,puVar13);
            puVar13 = extraout_RDX_02;
            if (cVar6 == '\0') break;
          }
        }
        if (local_c8 != (IRContext *)0x0) {
          (*(code *)local_c8)(&local_d8,&local_d8,3);
          puVar13 = extraout_RDX_03;
        }
        if (local_88 != (code *)0x0) {
          (*local_88)(&local_98,&local_98,3);
          puVar13 = extraout_RDX_04;
        }
      }
      puVar11 = local_68 + 1;
    } while (puVar11 != local_70);
  }
  pIVar9 = (this->loop_->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar8 = 0;
  uVar7 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pLVar2 = local_78;
  pIVar9 = (local_78->loop_header_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if (pIVar9->has_result_id_ == true) {
    uVar8 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  pIVar1 = this->context_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  this_00 = (pIVar1->def_use_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  local_d8._4_4_ = 0;
  local_d8._0_4_ = uVar8;
  pcStack_c0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:527:23)>
               ::_M_invoke;
  local_c8 = (IRContext *)
             std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:527:23)>
             ::_M_manager;
  local_d8._8_8_ = this;
  analysis::DefUseManager::ForEachUse
            (this_00,uVar7,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_d8)
  ;
  pLVar5 = local_a0;
  if (local_c8 != (IRContext *)0x0) {
    (*(code *)local_c8)(&local_d8,&local_d8,3);
  }
  pBVar10 = Loop::GetOrCreatePreHeaderBlock(this->loop_);
  pIVar9 = (pBVar10->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar7 = 0;
  if (pIVar9->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar9,(uint)pIVar9->has_type_id_);
  }
  local_d8._M_unused._M_member_pointer = local_b0 & 0xffffffff;
  pcStack_c0 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:535:7)>
               ::_M_invoke;
  local_c8 = (IRContext *)
             std::
             _Function_handler<void_(spvtools::opt::Instruction_*,_unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_utils.cpp:535:7)>
             ::_M_manager;
  local_d8._8_8_ = this;
  analysis::DefUseManager::ForEachUse
            (this_00,uVar7,(function<void_(spvtools::opt::Instruction_*,_unsigned_int)> *)&local_d8)
  ;
  if (local_c8 != (IRContext *)0x0) {
    (*(code *)local_c8)(&local_d8,&local_d8,3);
  }
  Loop::SetMergeBlock(pLVar2,local_e0._M_head_impl);
  Loop::SetPreHeaderBlock(pLVar2,this->loop_->loop_preheader_);
  std::
  vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
  ::
  emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
            ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
              *)&pLVar5->cloned_bb_,
             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)&local_e0);
  if (local_e0._M_head_impl != (BasicBlock *)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)&local_e0,local_e0._M_head_impl);
  }
  return pLVar2;
}

Assistant:

Loop* LoopUtils::CloneAndAttachLoopToHeader(LoopCloningResult* cloning_result) {
  // Clone the loop.
  Loop* new_loop = CloneLoop(cloning_result);

  // Create a new exit block/label for the new loop.
  // TODO(1841): Handle id overflow.
  std::unique_ptr<Instruction> new_label{new Instruction(
      context_, spv::Op::OpLabel, 0, context_->TakeNextId(), {})};
  std::unique_ptr<BasicBlock> new_exit_bb{new BasicBlock(std::move(new_label))};
  new_exit_bb->SetParent(loop_->GetMergeBlock()->GetParent());

  // Create an unconditional branch to the header block.
  InstructionBuilder builder{context_, new_exit_bb.get()};
  builder.AddBranch(loop_->GetHeaderBlock()->id());

  // Save the ids of the new and old merge block.
  const uint32_t old_merge_block = loop_->GetMergeBlock()->id();
  const uint32_t new_merge_block = new_exit_bb->id();

  // Replace the uses of the old merge block in the new loop with the new merge
  // block.
  for (std::unique_ptr<BasicBlock>& basic_block : cloning_result->cloned_bb_) {
    for (Instruction& inst : *basic_block) {
      // For each operand in each instruction check if it is using the old merge
      // block and change it to be the new merge block.
      auto replace_merge_use = [old_merge_block,
                                new_merge_block](uint32_t* id) {
        if (*id == old_merge_block) *id = new_merge_block;
      };
      inst.ForEachInOperand(replace_merge_use);
    }
  }

  const uint32_t old_header = loop_->GetHeaderBlock()->id();
  const uint32_t new_header = new_loop->GetHeaderBlock()->id();
  analysis::DefUseManager* def_use = context_->get_def_use_mgr();

  def_use->ForEachUse(old_header,
                      [new_header, this](Instruction* inst, uint32_t operand) {
                        if (!this->loop_->IsInsideLoop(inst))
                          inst->SetOperand(operand, {new_header});
                      });

  // TODO(1841): Handle failure to create pre-header.
  def_use->ForEachUse(
      loop_->GetOrCreatePreHeaderBlock()->id(),
      [new_merge_block, this](Instruction* inst, uint32_t operand) {
        if (this->loop_->IsInsideLoop(inst))
          inst->SetOperand(operand, {new_merge_block});

      });
  new_loop->SetMergeBlock(new_exit_bb.get());

  new_loop->SetPreHeaderBlock(loop_->GetPreHeaderBlock());

  // Add the new block into the cloned instructions.
  cloning_result->cloned_bb_.push_back(std::move(new_exit_bb));

  return new_loop;
}